

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  int iVar2;
  ProgressData *bar_00;
  long lVar3;
  double dVar4;
  timeval newer;
  int local_1c0;
  int num;
  int barwidth;
  double percent;
  double frac;
  char format [40];
  undefined1 local_178 [8];
  char line [257];
  curl_off_t point;
  curl_off_t total;
  ProgressData *bar;
  OperationConfig *config;
  per_transfer *per;
  timeval now;
  curl_off_t ulnow_local;
  curl_off_t ultotal_local;
  curl_off_t dlnow_local;
  curl_off_t dltotal_local;
  void *clientp_local;
  
  newer = tvnow();
  lVar1 = *(long *)((long)clientp + 0x10);
  bar_00 = (ProgressData *)((long)clientp + 0x80);
  if ((*(long *)((long)clientp + 0xb0) < 0) ||
     (0x7fffffffffffffff - *(long *)((long)clientp + 0xb0) < dltotal + ultotal)) {
    point = 0x7fffffffffffffff;
  }
  else {
    point = dltotal + ultotal + *(long *)((long)clientp + 0xb0);
  }
  if ((*(long *)((long)clientp + 0xb0) < 0) ||
     (0x7fffffffffffffff - *(long *)((long)clientp + 0xb0) < dlnow + ulnow)) {
    stack0xffffffffffffff90 = 0x7fffffffffffffff;
  }
  else {
    register0x00000000 = dlnow + ulnow + *(long *)((long)clientp + 0xb0);
  }
  if (bar_00->calls != 0) {
    if (point == 0) {
      lVar3 = tvdiff(newer,*(timeval *)((long)clientp + 0x90));
      if (lVar3 < 100) {
        return 0;
      }
      fly(bar_00,stack0xffffffffffffff90 != *(long *)((long)clientp + 0x88));
    }
    else {
      if (*(long *)((long)clientp + 0x88) == stack0xffffffffffffff90) {
        return 0;
      }
      lVar3 = tvdiff(newer,*(timeval *)((long)clientp + 0x90));
      if ((lVar3 < 100) && (stack0xffffffffffffff90 < point)) {
        return 0;
      }
    }
  }
  bar_00->calls = bar_00->calls + 1;
  if ((0 < point) && (stack0xffffffffffffff90 != *(long *)((long)clientp + 0x88))) {
    if (point < stack0xffffffffffffff90) {
      point = stack0xffffffffffffff90;
    }
    dVar4 = (double)stack0xffffffffffffff90;
    iVar2 = *(int *)((long)clientp + 0xa0) + -7;
    local_1c0 = (int)((double)iVar2 * (dVar4 / (double)point));
    if (0x100 < local_1c0) {
      local_1c0 = 0x100;
    }
    memset(local_178,0x23,(long)local_1c0);
    local_178[local_1c0] = 0;
    curl_msnprintf(&frac,0x28,"\r%%-%ds %%5.1f%%%%",iVar2);
    curl_mfprintf((dVar4 / (double)point) * 100.0,*(undefined8 *)((long)clientp + 0xa8),&frac,
                  local_178);
  }
  fflush(*(FILE **)((long)clientp + 0xa8));
  *(long *)((long)clientp + 0x88) = stack0xffffffffffffff90;
  per = (per_transfer *)newer.tv_sec;
  *(per_transfer **)((long)clientp + 0x90) = per;
  now.tv_sec = newer.tv_usec;
  *(__time_t *)((long)clientp + 0x98) = now.tv_sec;
  if ((*(byte *)(lVar1 + 0x2fa) & 1) != 0) {
    *(undefined1 *)(lVar1 + 0x2fa) = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x18),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  struct timeval now = tvnow();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero
     when indicating that we are expecting to get the filesize from the
     remote */
  if(bar->initial_size < 0 ||
     ((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal)))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0 ||
     ((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow)))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress didn't change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we're at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    int num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}